

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

string * anon_unknown.dwarf_405ff::get_word(string *__return_storage_ptr__,string *str_to_parse)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  string local_50 [32];
  
  pcVar1 = (str_to_parse->_M_dataplus)._M_p;
  uVar2 = str_to_parse->_M_string_length;
  uVar4 = 0;
  while ((uVar5 = uVar2, uVar2 != uVar4 &&
         (iVar3 = isspace((int)pcVar1[uVar4]), uVar5 = uVar4, iVar3 != 0))) {
    uVar4 = uVar4 + 1;
  }
  while ((uVar5 < uVar2 && (iVar3 = isspace((int)pcVar1[uVar5]), iVar3 == 0))) {
    uVar5 = uVar5 + 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str_to_parse);
  std::__cxx11::string::substr((ulong)local_50,(ulong)str_to_parse);
  std::__cxx11::string::operator=((string *)str_to_parse,local_50);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string get_word(std::string& str_to_parse) {
    size_t i = 0;
    for (; i < str_to_parse.size(); ++i) if (!std::isspace(str_to_parse[i])) break;
    for (; i < str_to_parse.size(); ++i) if (std::isspace(str_to_parse[i])) break;
    std::string word = str_to_parse.substr(0, i);
    str_to_parse = str_to_parse.substr(i);
    return word;
}